

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O3

int nn_ins_bind(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  nn_list_item *it;
  nn_list_item *pnVar2;
  char *pcVar3;
  char *pcVar4;
  nn_ins_item *it_00;
  nn_ins_item *pnVar5;
  
  nn_mutex_lock(&self.sync);
  it = nn_list_begin(&self.bound);
  pnVar2 = nn_list_end(&self.bound);
  if (it != pnVar2) {
    do {
      pcVar3 = nn_ep_getaddr((nn_ep *)it[1].next);
      pcVar4 = nn_ep_getaddr(item->ep);
      iVar1 = strncmp(pcVar3,pcVar4,0x80);
      if (iVar1 == 0) {
        iVar1 = -0x62;
        goto LAB_00153cfd;
      }
      it = nn_list_next(&self.bound,it);
      pnVar2 = nn_list_end(&self.bound);
    } while (it != pnVar2);
  }
  pnVar2 = nn_list_end(&self.bound);
  nn_list_insert(&self.bound,&item->item,pnVar2);
  it_00 = (nn_ins_item *)nn_list_begin(&self.connected);
  pnVar5 = (nn_ins_item *)nn_list_end(&self.connected);
  iVar1 = 0;
  if (it_00 != pnVar5) {
    do {
      pcVar3 = nn_ep_getaddr(item->ep);
      pcVar4 = nn_ep_getaddr(it_00->ep);
      iVar1 = strncmp(pcVar3,pcVar4,0x80);
      if ((iVar1 == 0) && (iVar1 = nn_ep_ispeer_ep(item->ep,it_00->ep), iVar1 != 0)) {
        (*fn)(item,it_00);
      }
      it_00 = (nn_ins_item *)nn_list_next(&self.connected,&it_00->item);
      pnVar5 = (nn_ins_item *)nn_list_end(&self.connected);
      iVar1 = 0;
    } while (it_00 != pnVar5);
  }
LAB_00153cfd:
  nn_mutex_unlock(&self.sync);
  return iVar1;
}

Assistant:

int nn_ins_bind (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;
    struct nn_ins_item *citem;

    nn_mutex_lock (&self.sync);

    /*  Check whether the endpoint isn't already bound. */
    /*  TODO:  This is an O(n) algorithm! */
    for (it = nn_list_begin (&self.bound); it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);

        if (strncmp (nn_ep_getaddr(bitem->ep), nn_ep_getaddr(item->ep),
            NN_SOCKADDR_MAX) == 0) {

            nn_mutex_unlock (&self.sync);
            return -EADDRINUSE;
        }
    }

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.bound, &item->item,
        nn_list_end (&self.bound));

    /*  During this process new pipes may be created. */
    for (it = nn_list_begin (&self.connected);
          it != nn_list_end (&self.connected);
          it = nn_list_next (&self.connected, it)) {
        citem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_ep_getaddr(item->ep), nn_ep_getaddr(citem->ep),
            NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_ep_ispeer_ep (item->ep, citem->ep))
                continue;

            fn (item, citem);
        }
    }

    nn_mutex_unlock (&self.sync);

    return 0;
}